

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::CreateFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  cmValue local_98;
  cmValue moddir_flag;
  string *default_mod_dir;
  allocator<char> local_71;
  string local_70;
  cmValue local_50;
  cmValue prop;
  string target_mod_dir;
  string *working_dir_local;
  cmGeneratorTarget *this_local;
  string *mod_dir;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&prop);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Fortran_MODULE_DIRECTORY",&local_71);
  local_50 = GetProperty(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = cmValue::operator_cast_to_bool(&local_50);
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_50);
    std::__cxx11::string::operator=((string *)&prop,(string *)psVar3);
  }
  else {
    moddir_flag.Value = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator)
    ;
    bVar1 = std::operator!=(moddir_flag.Value,working_dir);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&prop,(string *)moddir_flag.Value);
    }
  }
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_Fortran_MODDIR_FLAG",&local_b9);
  local_98 = cmMakefile::GetDefinition(this_00,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = cmValue::operator_cast_to_bool(&local_98), bVar1)) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&prop);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&prop);
    }
    else {
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
      cmAlphaNum::cmAlphaNum(&local_110,psVar3);
      cmAlphaNum::cmAlphaNum(&local_140,'/');
      cmStrCat<std::__cxx11::string>
                (&local_e0,&local_110,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  }
  std::__cxx11::string::~string((string *)&prop);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CreateFortranModuleDirectory(
  std::string const& working_dir) const
{
  std::string mod_dir;
  std::string target_mod_dir;
  if (cmValue prop = this->GetProperty("Fortran_MODULE_DIRECTORY")) {
    target_mod_dir = *prop;
  } else {
    std::string const& default_mod_dir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    if (default_mod_dir != working_dir) {
      target_mod_dir = default_mod_dir;
    }
  }
  cmValue moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if (!target_mod_dir.empty() && moddir_flag) {
    // Compute the full path to the module directory.
    if (cmSystemTools::FileIsFullPath(target_mod_dir)) {
      // Already a full path.
      mod_dir = target_mod_dir;
    } else {
      // Interpret relative to the current output directory.
      mod_dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                         '/', target_mod_dir);
    }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
  }
  return mod_dir;
}